

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

void vk::BinaryRegistryDetail::anon_unknown_8::normalizeSparseIndex(SparseIndexNode *group)

{
  value_type pSVar1;
  undefined8 uVar2;
  value_type pSVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  value_type local_28;
  
  pSVar3 = (value_type)
           (group->children).
           super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((value_type)
      (group->children).
      super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar3) {
    uVar7 = 0xffffffff;
    uVar9 = 0;
    local_28 = pSVar3;
    do {
      normalizeSparseIndex(*(SparseIndexNode **)(&pSVar3->word + uVar9 * 2));
      pSVar3 = (value_type)
               (group->children).
               super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar1 = (value_type)
               (group->children).
               super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (**(int **)(&pSVar3->word + uVar9 * 2) == 0) {
        uVar7 = uVar9 & 0xffffffff;
      }
      uVar9 = uVar9 + 1;
      uVar4 = (long)pSVar1 - (long)pSVar3;
      uVar8 = (long)uVar4 >> 3;
    } while (uVar9 < uVar8);
    if ((int)uVar7 < 0) {
      if (pSVar3 != pSVar1) {
        std::
        vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
        ::reserve(&group->children,uVar8 + 1);
        local_28 = (value_type)operator_new(0x20);
        local_28->word = 0;
        local_28->index = 0;
        (local_28->children).
        super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_28->children).
        super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_28->children).
        super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
        ::push_back(&group->children,&local_28);
      }
    }
    else if ((int)uVar7 != (int)(uVar4 >> 3) + -1) {
      do {
        iVar5 = (int)uVar7;
        uVar6 = iVar5 + 1;
        uVar7 = (ulong)uVar6;
        uVar2 = *(undefined8 *)(&pSVar3->word + (long)iVar5 * 2);
        *(undefined8 *)(&pSVar3->word + (long)iVar5 * 2) =
             *(undefined8 *)(&pSVar3->word + (long)(int)uVar6 * 2);
        *(undefined8 *)(&pSVar3->word + (long)(int)uVar6 * 2) = uVar2;
        pSVar3 = (value_type)
                 (group->children).
                 super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (iVar5 != (int)((ulong)((long)(group->children).
                                            super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar3) >> 3) + -2);
    }
  }
  return;
}

Assistant:

void normalizeSparseIndex (SparseIndexNode* group)
{
	int		zeroChildPos	= -1;

	for (size_t childNdx = 0; childNdx < group->children.size(); childNdx++)
	{
		normalizeSparseIndex(group->children[childNdx]);

		if (group->children[childNdx]->word == 0)
		{
			DE_ASSERT(zeroChildPos < 0);
			zeroChildPos = (int)childNdx;
		}
	}

	if (zeroChildPos >= 0)
	{
		// Move child with word = 0 to last
		while (zeroChildPos != (int)group->children.size()-1)
		{
			std::swap(group->children[zeroChildPos], group->children[zeroChildPos+1]);
			zeroChildPos += 1;
		}
	}
	else if (!group->children.empty())
	{
		group->children.reserve(group->children.size()+1);
		group->children.push_back(new SparseIndexNode(0, 0));
	}
}